

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O2

int lws_gate_accepts(lws_context *context,int on)

{
  lws_dll2 *plVar1;
  int iVar2;
  lws_vhost *plVar3;
  
  plVar3 = context->vhost_list;
  _lws_log(4,"%s: on = %d\n","lws_gate_accepts",on);
  for (; plVar3 != (lws_vhost *)0x0; plVar3 = plVar3->vhost_next) {
    plVar1 = (lws_dll2 *)&plVar3->listen_wsi;
    while (plVar1 = plVar1->next, plVar1 != (lws_dll2 *)0x0) {
      if (((plVar3->tls).use_ssl != 0) &&
         (iVar2 = lws_change_pollfd((lws *)&plVar1[-0x1b].next,(uint)(on == 0),(uint)(on != 0)),
         iVar2 != 0)) {
        _lws_log(4,"%s: Unable to set POLLIN %d\n","lws_gate_accepts",on);
      }
    }
  }
  return 0;
}

Assistant:

int
lws_gate_accepts(struct lws_context *context, int on)
{
	struct lws_vhost *v = context->vhost_list;

	lwsl_notice("%s: on = %d\n", __func__, on);

	while (v) {
		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&v->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			if (v->tls.use_ssl &&
			    lws_change_pollfd(wsi, on ? 0 : LWS_POLLIN,
						   on ? LWS_POLLIN : 0))
				lwsl_notice("%s: Unable to set POLLIN %d\n",
					    __func__, on);
		} lws_end_foreach_dll(d);

		v = v->vhost_next;
	}

	return 0;
}